

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall QDirListingPrivate::beginIterating(QDirListingPrivate *this)

{
  std::
  vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
  ::clear(&this->nativeIterators);
  std::
  vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
  ::clear(&this->fileEngineIterators);
  QDuplicateTracker<QString,_32UL>::clear(&this->visitedLinks);
  pushDirectory(this,&this->initialEntryInfo);
  return;
}

Assistant:

void QDirListingPrivate::beginIterating()
{
#ifndef QT_NO_FILESYSTEMITERATOR
    nativeIterators.clear();
#endif
    fileEngineIterators.clear();
    visitedLinks.clear();
    pushDirectory(initialEntryInfo);
}